

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall flatbuffers::Parser::ParseField(Parser *this,StructDef *struct_def)

{
  int extraout_EAX;
  int iVar1;
  FieldDef *def;
  Value *pVVar2;
  undefined8 extraout_RAX;
  Parser *pPVar3;
  allocator local_99;
  undefined1 local_98 [40];
  size_t sStack_70;
  pointer local_68;
  string name;
  string dc;
  
  std::__cxx11::string::string((string *)&name,(string *)&this->attribute_);
  std::__cxx11::string::string((string *)&dc,(string *)&this->doc_comment_);
  Expect(this,4);
  Expect(this,0x3a);
  local_98._32_8_ = (_Base_ptr)0x0;
  sStack_70 = 0;
  local_68 = (pointer)0x0;
  pPVar3 = this;
  ParseType(this,(Type *)(local_98 + 0x20));
  iVar1 = local_98._32_4_;
  if (struct_def->fixed == true) {
    if ((local_98._32_4_ - 1 < 0xc) ||
       ((local_98._32_4_ == 0xf && (*(char *)(sStack_70 + 0xd8) != '\0')))) goto LAB_0011134b;
    std::__cxx11::string::string
              ((string *)local_98,"structs_ may contain only scalar or struct fields",&local_99);
    pPVar3 = (Parser *)local_98;
    Error((string *)pPVar3);
    iVar1 = extraout_EAX;
  }
  if (iVar1 == 0x10) {
    pPVar3 = (Parser *)local_98;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar3,&name
                   ,"_type");
    AddField(pPVar3,struct_def,(string *)local_98,(Type *)(local_68 + 0x1c));
    pPVar3 = (Parser *)local_98;
    std::__cxx11::string::~string((string *)pPVar3);
  }
LAB_0011134b:
  def = AddField(pPVar3,struct_def,&name,(Type *)(local_98 + 0x20));
  if (this->token_ == 0x3d) {
    Next(this);
    ParseSingleValue(this,&def->value);
  }
  std::__cxx11::string::_M_assign((string *)&(def->super_Definition).doc_comment);
  ParseMetaData(this,&def->super_Definition);
  std::__cxx11::string::string((string *)local_98,"deprecated",&local_99);
  pVVar2 = SymbolTable<flatbuffers::Value>::Lookup
                     (&(def->super_Definition).attributes,(string *)local_98);
  def->deprecated = pVVar2 != (Value *)0x0;
  std::__cxx11::string::~string((string *)local_98);
  if ((def->deprecated == true) && (struct_def->fixed == true)) {
    std::__cxx11::string::string((string *)local_98,"can\'t deprecate fields in a struct",&local_99)
    ;
    Error((string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)&dc);
    std::__cxx11::string::~string((string *)&name);
    _Unwind_Resume(extraout_RAX);
  }
  Expect(this,0x3b);
  std::__cxx11::string::~string((string *)&dc);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void Parser::ParseField(StructDef &struct_def) {
  std::string name = attribute_;
  std::string dc = doc_comment_;
  Expect(kTokenIdentifier);
  Expect(':');
  Type type;
  ParseType(type);

  if (struct_def.fixed && !IsScalar(type.base_type) && !IsStruct(type))
    Error("structs_ may contain only scalar or struct fields");

  if (type.base_type == BASE_TYPE_UNION) {
    // For union fields, add a second auto-generated field to hold the type,
    // with _type appended as the name.
    AddField(struct_def, name + "_type", type.enum_def->underlying_type);
  }

  auto &field = AddField(struct_def, name, type);

  if (token_ == '=') {
    Next();
    ParseSingleValue(field.value);
  }

  field.doc_comment = dc;
  ParseMetaData(field);
  field.deprecated = field.attributes.Lookup("deprecated") != nullptr;
  if (field.deprecated && struct_def.fixed)
    Error("can't deprecate fields in a struct");

  Expect(';');
}